

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O3

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::SecretManager::CreateSecret
          (SecretManager *this,ClientContext *context,CreateSecretInput *input)

{
  pointer pcVar1;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  pointer __p;
  InternalException *this_00;
  CreateSecretInput *in_RCX;
  optional_ptr<duckdb::CreateSecretFunction,_true> function_lookup;
  SecretType secret_type;
  CatalogTransaction transaction;
  CreateSecretInput function_input;
  element_type *local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [104];
  CatalogTransaction local_130;
  undefined1 local_108 [152];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_70;
  
  CatalogTransaction::GetSystemCatalogTransaction(&local_130,(ClientContext *)input);
  transaction_00.context.ptr = local_130.context.ptr;
  transaction_00.db.ptr = local_130.db.ptr;
  transaction_00.transaction.ptr = local_130.transaction.ptr;
  transaction_00.transaction_id = local_130.transaction_id;
  transaction_00.start_time = local_130.start_time;
  InitializeSecrets((SecretManager *)context,transaction_00);
  CreateSecretInput::CreateSecretInput((CreateSecretInput *)local_108,in_RCX);
  if (local_108._40_8_ == 0) {
    LookupTypeInternal((SecretType *)local_198,(SecretManager *)context,(string *)local_108);
    ::std::__cxx11::string::_M_assign((string *)(local_108 + 0x20));
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._72_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_198 + 0x58)) {
      operator_delete((void *)local_198._72_8_);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._40_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_198 + 0x38)) {
      operator_delete((void *)local_198._40_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ !=
        &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)->field_2)
    {
      operator_delete((void *)local_198._0_8_);
    }
  }
  local_1e8._8_8_ =
       LookupFunctionInternal
                 ((SecretManager *)context,(string *)local_108,(string *)(local_108 + 0x20));
  if ((CreateSecretFunction *)local_1e8._8_8_ != (CreateSecretFunction *)0x0) {
    optional_ptr<duckdb::CreateSecretFunction,_true>::CheckValid
              ((optional_ptr<duckdb::CreateSecretFunction,_true> *)(local_1e8 + 8));
    (*(code *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._8_8_ + 0x40))->
              _vptr__Sp_counted_base)((ClientContext *)local_1e8,input);
    local_1f0 = (element_type *)local_1e8._0_8_;
    if ((element_type *)local_1e8._0_8_ != (element_type *)0x0) {
      local_1e8._0_8_ = (element_type *)0x0;
      transaction_01.context.ptr = local_130.context.ptr;
      transaction_01.db.ptr = local_130.db.ptr;
      transaction_01.transaction.ptr = local_130.transaction.ptr;
      transaction_01.transaction_id = local_130.transaction_id;
      transaction_01.start_time = local_130.start_time;
      RegisterSecretInternal
                (this,transaction_01,
                 (unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
                  *)context,(OnCreateConflict)&local_1f0,in_RCX->on_conflict,
                 (string *)(ulong)in_RCX->persist_type);
      if (local_1f0 != (element_type *)0x0) {
        (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&((local_1f0->super_enable_shared_from_this<duckdb::ClientContext>).
                           __weak_this_.internal.
                           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext> + 8))->_M_pi
        )();
      }
      local_1f0 = (element_type *)0x0;
      if ((element_type *)local_1e8._0_8_ != (element_type *)0x0) {
        (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&((((enable_shared_from_this<duckdb::ClientContext> *)local_1e8._0_8_)->
                           __weak_this_).internal.
                           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext> + 8))->_M_pi
        )();
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_70);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_108 + 0x80));
      if ((undefined1 *)local_108._96_8_ != local_108 + 0x70) {
        operator_delete((void *)local_108._96_8_);
      }
      if ((undefined1 *)local_108._64_8_ != local_108 + 0x50) {
        operator_delete((void *)local_108._64_8_);
      }
      if ((undefined1 *)local_108._32_8_ != local_108 + 0x30) {
        operator_delete((void *)local_108._32_8_);
      }
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_);
      }
      return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
             (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
    }
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_198._0_8_ =
         &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,
               "CreateSecretFunction for type: \'%s\' and provider: \'%s\' did not return a secret!"
               ,"");
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    pcVar1 = (in_RCX->type)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar1,pcVar1 + (in_RCX->type)._M_string_length);
    local_1d8._0_8_ = local_1d8 + 0x10;
    pcVar1 = (in_RCX->provider)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1e8 + 0x10),pcVar1,pcVar1 + (in_RCX->provider)._M_string_length);
    InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
              (this_00,(string *)local_198,&local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1e8 + 0x10));
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ThrowProviderNotFoundError((SecretManager *)context,&in_RCX->type,&in_RCX->provider,false);
}

Assistant:

unique_ptr<SecretEntry> SecretManager::CreateSecret(ClientContext &context, const CreateSecretInput &input) {
	// Note that a context is required for CreateSecret, as the CreateSecretFunction expects one
	auto transaction = CatalogTransaction::GetSystemCatalogTransaction(context);
	InitializeSecrets(transaction);

	// Make a copy to set the provider to default if necessary
	auto function_input = input;
	if (function_input.provider.empty()) {
		auto secret_type = LookupTypeInternal(function_input.type);
		function_input.provider = secret_type.default_provider;
	}

	// Lookup function
	auto function_lookup = LookupFunctionInternal(function_input.type, function_input.provider);
	if (!function_lookup) {
		ThrowProviderNotFoundError(input.type, input.provider);
	}

	// Call the function
	auto secret = function_lookup->function(context, function_input);

	if (!secret) {
		throw InternalException("CreateSecretFunction for type: '%s' and provider: '%s' did not return a secret!",
		                        input.type, input.provider);
	}

	// Register the secret at the secret_manager
	return RegisterSecretInternal(transaction, std::move(secret), input.on_conflict, input.persist_type,
	                              input.storage_type);
}